

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderColorRectWithAlphaCheckerboard
               (ImDrawList *draw_list,ImVec2 p_min,ImVec2 p_max,ImU32 col,float grid_step,
               ImVec2 grid_off,float rounding,ImDrawFlags flags)

{
  ImDrawList *this;
  ImU32 IVar1;
  uint local_74;
  ImVec2 local_70;
  ImVec2 local_68;
  uint local_60;
  float local_5c;
  ImDrawFlags cell_flags;
  float x2;
  float x1;
  float x;
  float y2;
  float y1;
  float y;
  int yi;
  ImU32 col_bg2;
  ImU32 col_bg1;
  ImDrawFlags flags_local;
  float rounding_local;
  float grid_step_local;
  ImU32 col_local;
  ImDrawList *draw_list_local;
  ImVec2 grid_off_local;
  ImVec2 p_max_local;
  ImVec2 p_min_local;
  
  col_bg2 = flags;
  if ((flags & 0x1f0U) == 0) {
    col_bg2 = 0xf0;
  }
  col_bg1 = (ImU32)rounding;
  flags_local = (ImDrawFlags)grid_step;
  rounding_local = (float)col;
  _grid_step_local = draw_list;
  draw_list_local = (ImDrawList *)grid_off;
  grid_off_local = p_max;
  p_max_local = p_min;
  if (col >> 0x18 < 0xff) {
    IVar1 = ImAlphaBlendColors(0xffcccccc,col);
    yi = GetColorU32(IVar1);
    IVar1 = ImAlphaBlendColors(0xff808080,(ImU32)rounding_local);
    y = (float)GetColorU32(IVar1);
    ImDrawList::AddRectFilled
              (_grid_step_local,&p_max_local,&grid_off_local,yi,(float)col_bg1,col_bg2);
    y1 = 0.0;
    for (y2 = p_max_local.y + draw_list_local._4_4_; y2 < grid_off_local.y;
        y2 = (float)flags_local + y2) {
      x = ImClamp<float>(y2,p_max_local.y,grid_off_local.y);
      x1 = ImMin<float>(y2 + (float)flags_local,grid_off_local.y);
      if (x < x1) {
        for (x2 = (float)((uint)y1 & 1) * (float)flags_local + p_max_local.x + draw_list_local._0_4_
            ; x2 < grid_off_local.x; x2 = (float)flags_local + (float)flags_local + x2) {
          cell_flags = (ImDrawFlags)ImClamp<float>(x2,p_max_local.x,grid_off_local.x);
          local_5c = ImMin<float>(x2 + (float)flags_local,grid_off_local.x);
          this = _grid_step_local;
          if ((float)cell_flags < local_5c) {
            local_60 = 0x100;
            if (x <= p_max_local.y) {
              if ((float)cell_flags <= p_max_local.x) {
                local_60 = 0x110;
              }
              if (grid_off_local.x <= local_5c) {
                local_60 = local_60 | 0x20;
              }
            }
            if (grid_off_local.y <= x1) {
              if ((float)cell_flags <= p_max_local.x) {
                local_60 = local_60 | 0x40;
              }
              if (grid_off_local.x <= local_5c) {
                local_60 = local_60 | 0x80;
              }
            }
            if ((col_bg2 == 0x100) || (local_60 == 0x100)) {
              local_74 = 0x100;
            }
            else {
              local_74 = local_60 & col_bg2;
            }
            local_60 = local_74;
            ImVec2::ImVec2(&local_68,(float)cell_flags,x);
            ImVec2::ImVec2(&local_70,local_5c,x1);
            ImDrawList::AddRectFilled(this,&local_68,&local_70,(ImU32)y,(float)col_bg1,local_60);
          }
        }
      }
      y1 = (float)((int)y1 + 1);
    }
  }
  else {
    ImDrawList::AddRectFilled(draw_list,&p_max_local,&grid_off_local,col,rounding,col_bg2);
  }
  return;
}

Assistant:

void ImGui::RenderColorRectWithAlphaCheckerboard(ImDrawList* draw_list, ImVec2 p_min, ImVec2 p_max, ImU32 col, float grid_step, ImVec2 grid_off, float rounding, ImDrawFlags flags)
{
    if ((flags & ImDrawFlags_RoundCornersMask_) == 0)
        flags = ImDrawFlags_RoundCornersDefault_;
    if (((col & IM_COL32_A_MASK) >> IM_COL32_A_SHIFT) < 0xFF)
    {
        ImU32 col_bg1 = GetColorU32(ImAlphaBlendColors(IM_COL32(204, 204, 204, 255), col));
        ImU32 col_bg2 = GetColorU32(ImAlphaBlendColors(IM_COL32(128, 128, 128, 255), col));
        draw_list->AddRectFilled(p_min, p_max, col_bg1, rounding, flags);

        int yi = 0;
        for (float y = p_min.y + grid_off.y; y < p_max.y; y += grid_step, yi++)
        {
            float y1 = ImClamp(y, p_min.y, p_max.y), y2 = ImMin(y + grid_step, p_max.y);
            if (y2 <= y1)
                continue;
            for (float x = p_min.x + grid_off.x + (yi & 1) * grid_step; x < p_max.x; x += grid_step * 2.0f)
            {
                float x1 = ImClamp(x, p_min.x, p_max.x), x2 = ImMin(x + grid_step, p_max.x);
                if (x2 <= x1)
                    continue;
                ImDrawFlags cell_flags = ImDrawFlags_RoundCornersNone;
                if (y1 <= p_min.y) { if (x1 <= p_min.x) cell_flags |= ImDrawFlags_RoundCornersTopLeft; if (x2 >= p_max.x) cell_flags |= ImDrawFlags_RoundCornersTopRight; }
                if (y2 >= p_max.y) { if (x1 <= p_min.x) cell_flags |= ImDrawFlags_RoundCornersBottomLeft; if (x2 >= p_max.x) cell_flags |= ImDrawFlags_RoundCornersBottomRight; }

                // Combine flags
                cell_flags = (flags == ImDrawFlags_RoundCornersNone || cell_flags == ImDrawFlags_RoundCornersNone) ? ImDrawFlags_RoundCornersNone : (cell_flags & flags);
                draw_list->AddRectFilled(ImVec2(x1, y1), ImVec2(x2, y2), col_bg2, rounding, cell_flags);
            }
        }
    }
    else
    {
        draw_list->AddRectFilled(p_min, p_max, col, rounding, flags);
    }
}